

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_support.c
# Opt level: O0

void test_success(constructor *new_,undefined1 *enable_,undefined1 *free_)

{
  int iVar1;
  archive *a_00;
  char *pcVar2;
  int result;
  archive *a;
  undefined1 *free__local;
  undefined1 *enable__local;
  constructor *new__local;
  
  a_00 = (*new_)();
  iVar1 = (*(code *)enable_)(a_00);
  if (iVar1 == -0x14) {
    pcVar2 = archive_error_string(a_00);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_support.c"
                     ,L'6',(uint)(pcVar2 != (char *)0x0),"NULL != archive_error_string(a)",
                     (void *)0x0);
    iVar1 = archive_errno(a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_support.c"
                        ,L'7',-1,"-1",(long)iVar1,"archive_errno(a)",a_00);
  }
  else {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_support.c"
                        ,L'9',0,"ARCHIVE_OK",(long)iVar1,"result",a_00);
    pcVar2 = archive_error_string(a_00);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_support.c"
                     ,L':',(uint)(pcVar2 == (char *)0x0),"NULL == archive_error_string(a)",
                     (void *)0x0);
    iVar1 = archive_errno(a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_support.c"
                        ,L';',0,"0",(long)iVar1,"archive_errno(a)",a_00);
  }
  (*(code *)free_)(a_00);
  return;
}

Assistant:

static void
test_success(constructor new_, enabler enable_, destructor free_)
{
	struct archive *a = new_();
	int result = enable_(a);
	if (result == ARCHIVE_WARN) {
		assert(NULL != archive_error_string(a));
		assertEqualIntA(a, -1, archive_errno(a));
	} else {
		assertEqualIntA(a, ARCHIVE_OK, result);
		assert(NULL == archive_error_string(a));
		assertEqualIntA(a, 0, archive_errno(a));
	}
	free_(a);
}